

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

uint16_t invert(uint16_t x,uint16_t q,uint64_t qrecip)

{
  uint16_t uVar1;
  undefined4 local_28;
  undefined4 local_24;
  uint32_t exp;
  uint32_t acc;
  uint32_t bit;
  uint32_t sq;
  uint64_t qrecip_local;
  uint16_t q_local;
  uint16_t x_local;
  
  acc = (uint32_t)x;
  exp = 1;
  local_24 = 1;
  local_28 = q - 2;
  do {
    if ((local_28 & exp) != 0) {
      uVar1 = reduce(local_24 * acc,q,qrecip);
      local_24 = (uint)uVar1;
      local_28 = (exp ^ 0xffffffff) & local_28;
      if (local_28 == 0) {
        return uVar1;
      }
    }
    uVar1 = reduce(acc * acc,q,qrecip);
    acc = (uint32_t)uVar1;
    exp = exp << 1;
  } while( true );
}

Assistant:

static uint16_t invert(uint16_t x, uint16_t q, uint64_t qrecip)
{
    /* Fermat inversion: compute x^(q-2), since x^(q-1) == 1. */
    uint32_t sq = x, bit = 1, acc = 1, exp = q-2;
    while (1) {
        if (exp & bit) {
            acc = reduce(acc * sq, q, qrecip);
            exp &= ~bit;
            if (!exp)
                return acc;
        }
        sq = reduce(sq * sq, q, qrecip);
        bit <<= 1;
    }
}